

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O1

void __thiscall
icu_63::NumeratorSubstitution::NumeratorSubstitution
          (NumeratorSubstitution *this,int32_t _pos,double _denominator,NFRuleSet *_ruleSet,
          UnicodeString *description,UErrorCode *status)

{
  short sVar1;
  int8_t iVar2;
  int64_t iVar3;
  int iVar4;
  int32_t iVar5;
  UnicodeString local_70;
  
  sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (description->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  iVar2 = UnicodeString::doCompare
                    (description,iVar5 + -2,2,
                     L"<<㙎捩彵㌶ㄲ慓敭慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟ㄳ临卆扵瑳瑩瑵潩䕮一椶畣㙟㈳䴲汵楴汰敩卲扵瑳瑩瑵潩䕮一椶畣㙟ㄳ䴹摯汵獵畓獢楴畴楴湯E㙎捩彵㌶㐲湉整牧污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㘲牆捡楴湯污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㔲扁潳畬整慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟㈳丱浵牥瑡牯畓獢楴畴楴湯E镋\xfff5长\xfff5镞\xfff5镭\xfff5陴\xfff5隴\xfff5阿\xfff5隴\xfff5隴\xfff5隴\xfff5陴\xfff5隴\xfff5陴\xfff5鯄\xfff5鯄\xfff5鯙\xfff5鰐\xfff5鰞\xfff5鰬\xfff5鯦\xfff5鯴\xfff5鰂\xfff5馐\xfff5驒\xfff5駯\xfff5騠\xfff5馿\xfff5驲\xfff5骃\xfff5騽\xfff5骔\xfff5駗\xfff5馆\xfff5鬢\xfff5鬵\xfff5鬢\xfff5鬢\xfff5鬢\xfff5鬽\xfff5鬢\xfff5鬧\xfff5㙎捩彵㌶渶浵敢㑲浩汰㌱潔敫䍮湯畳敭䕲一椶畣㙟㘳畮扭牥椴灭ㅬ匴浹潢偬潲楶敤䕲"
                     ,0,2);
  if (iVar2 == '\0') {
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    UnicodeString::UnicodeString(&local_70,description,0,iVar4 + -1);
  }
  else {
    UnicodeString::UnicodeString(&local_70,description);
  }
  NFSubstitution::NFSubstitution(&this->super_NFSubstitution,_pos,_ruleSet,&local_70,status);
  UnicodeString::~UnicodeString(&local_70);
  (this->super_NFSubstitution).super_UObject._vptr_UObject =
       (_func_int **)&PTR__NumeratorSubstitution_003ab5c0;
  this->denominator = _denominator;
  iVar3 = util64_fromDouble(_denominator);
  this->ldenominator = iVar3;
  sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (description->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  iVar2 = UnicodeString::doCompare
                    (description,iVar5 + -2,2,
                     L"<<㙎捩彵㌶ㄲ慓敭慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟ㄳ临卆扵瑳瑩瑵潩䕮一椶畣㙟㈳䴲汵楴汰敩卲扵瑳瑩瑵潩䕮一椶畣㙟ㄳ䴹摯汵獵畓獢楴畴楴湯E㙎捩彵㌶㐲湉整牧污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㘲牆捡楴湯污慐瑲畓獢楴畴楴湯E㙎捩彵㌶㔲扁潳畬整慖畬卥扵瑳瑩瑵潩䕮一椶畣㙟㈳丱浵牥瑡牯畓獢楴畴楴湯E镋\xfff5长\xfff5镞\xfff5镭\xfff5陴\xfff5隴\xfff5阿\xfff5隴\xfff5隴\xfff5隴\xfff5陴\xfff5隴\xfff5陴\xfff5鯄\xfff5鯄\xfff5鯙\xfff5鰐\xfff5鰞\xfff5鰬\xfff5鯦\xfff5鯴\xfff5鰂\xfff5馐\xfff5驒\xfff5駯\xfff5騠\xfff5馿\xfff5驲\xfff5骃\xfff5騽\xfff5骔\xfff5駗\xfff5馆\xfff5鬢\xfff5鬵\xfff5鬢\xfff5鬢\xfff5鬢\xfff5鬽\xfff5鬢\xfff5鬧\xfff5㙎捩彵㌶渶浵敢㑲浩汰㌱潔敫䍮湯畳敭䕲一椶畣㙟㘳畮扭牥椴灭ㅬ匴浹潢偬潲楶敤䕲"
                     ,0,2);
  this->withZeros = iVar2 == '\0';
  return;
}

Assistant:

NumeratorSubstitution(int32_t _pos,
        double _denominator,
        NFRuleSet* _ruleSet,
        const UnicodeString& description,
        UErrorCode& status)
        : NFSubstitution(_pos, _ruleSet, fixdesc(description), status), denominator(_denominator) 
    {
        ldenominator = util64_fromDouble(denominator);
        withZeros = description.endsWith(LTLT, 2);
    }